

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall SQCompilation::CheckerVisitor::visitTerExpr(CheckerVisitor *this,TerExpr *expr)

{
  int iVar1;
  undefined4 extraout_var;
  CheckerVisitor *visitor;
  void *extraout_RDX;
  TerExpr *in_RSI;
  CheckerVisitor *in_RDI;
  CheckerVisitor *unaff_retaddr;
  VarScope *ifFalseScope;
  VarScope *ifTrueScope;
  VarScope *trunkScope;
  VarScope *in_stack_00000028;
  VarScope *in_stack_00000030;
  TerExpr *in_stack_ffffffffffffffb8;
  CheckerVisitor *this_01;
  CheckerVisitor *in_stack_ffffffffffffffc8;
  CheckerVisitor *in_stack_ffffffffffffffd0;
  TerExpr *in_stack_ffffffffffffffd8;
  VarScope *this_02;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  CheckerVisitor *other;
  VarScope *this_00;
  undefined4 extraout_var_00;
  
  other = in_RDI;
  checkTernaryPriority(unaff_retaddr,(TerExpr *)in_RDI);
  checkSameValues(in_stack_ffffffffffffffd0,(TerExpr *)in_stack_ffffffffffffffc8);
  checkAlwaysTrueOrFalse(in_RDI,in_stack_ffffffffffffffb8);
  checkCanBeSimplified
            ((CheckerVisitor *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  std::
  vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
  ::push_back((vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
               *)in_RDI,(value_type *)in_stack_ffffffffffffffb8);
  TerExpr::a(in_RSI);
  Node::visit<SQCompilation::CheckerVisitor>
            ((Node *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  this_02 = in_RDI->currentScope;
  iVar1 = VarScope::copy(this_02,(EVP_PKEY_CTX *)in_RDI->arena,(EVP_PKEY_CTX *)0x0);
  this_00 = (VarScope *)CONCAT44(extraout_var,iVar1);
  iVar1 = VarScope::copy(this_02,(EVP_PKEY_CTX *)in_RDI->arena,(EVP_PKEY_CTX *)0x0);
  visitor = (CheckerVisitor *)CONCAT44(extraout_var_00,iVar1);
  TerExpr::a(in_RSI);
  speculateIfConditionHeuristics
            (this,&expr->super_Expr,in_stack_00000030,in_stack_00000028,trunkScope._7_1_);
  in_RDI->currentScope = this_00;
  TerExpr::b(in_RSI);
  this_01 = in_RDI;
  Node::visit<SQCompilation::CheckerVisitor>((Node *)this_00,visitor);
  this_01->currentScope = (VarScope *)visitor;
  TerExpr::c(in_RSI,in_RDI,extraout_RDX);
  Node::visit<SQCompilation::CheckerVisitor>((Node *)this_00,visitor);
  std::
  vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
  ::pop_back((vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
              *)0x18f1ad);
  VarScope::merge(in_stack_00000030,in_stack_00000028);
  VarScope::copyFrom((VarScope *)unaff_retaddr,(VarScope *)other);
  VarScope::~VarScope((VarScope *)this_01);
  VarScope::~VarScope((VarScope *)this_01);
  this_01->currentScope = this_02;
  return;
}

Assistant:

void CheckerVisitor::visitTerExpr(TerExpr *expr) {
  checkTernaryPriority(expr);
  checkSameValues(expr);
  checkAlwaysTrueOrFalse(expr);
  checkCanBeSimplified(expr);

  nodeStack.push_back({ SST_NODE, expr });

  expr->a()->visit(this);

  VarScope *trunkScope = currentScope;

  VarScope *ifTrueScope = trunkScope->copy(arena);
  VarScope *ifFalseScope = trunkScope->copy(arena);

  speculateIfConditionHeuristics(expr->a(), ifTrueScope, ifFalseScope);

  currentScope = ifTrueScope;
  expr->b()->visit(this);

  currentScope = ifFalseScope;
  expr->c()->visit(this);

  nodeStack.pop_back();

  ifTrueScope->merge(ifFalseScope);

  trunkScope->copyFrom(ifTrueScope);

  ifTrueScope->~VarScope();
  ifFalseScope->~VarScope();

  currentScope = trunkScope;
}